

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O0

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::AnyPointer::Reader::getPipelinedCap(Reader *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  unsigned_short uVar1;
  Own<capnp::ClientHook,_std::nullptr_t> OVar2;
  StructReader local_b8;
  PointerReader local_88;
  PipelineOp *local_68;
  PipelineOp *op;
  PipelineOp *__end1;
  PipelineOp *__begin1;
  ArrayPtr<const_capnp::PipelineOp> *__range1;
  PointerReader pointer;
  Reader *this_local;
  ArrayPtr<const_capnp::PipelineOp> ops_local;
  
  this_local = (Reader *)ops.size_;
  pointer._24_8_ = ops.ptr;
  __range1 = *(ArrayPtr<const_capnp::PipelineOp> **)pointer._24_8_;
  pointer.segment = *(SegmentReader **)(pointer._24_8_ + 8);
  pointer.capTable = *(CapTableReader **)(pointer._24_8_ + 0x10);
  pointer.pointer = *(WirePointer **)(pointer._24_8_ + 0x18);
  __begin1 = (PipelineOp *)&this_local;
  ops_local.size_ = (size_t)this;
  __end1 = kj::ArrayPtr<const_capnp::PipelineOp>::begin
                     ((ArrayPtr<const_capnp::PipelineOp> *)__begin1);
  op = kj::ArrayPtr<const_capnp::PipelineOp>::end((ArrayPtr<const_capnp::PipelineOp> *)__begin1);
  for (; __end1 != op; __end1 = __end1 + 1) {
    local_68 = __end1;
    if ((__end1->type != NOOP) && (__end1->type == GET_POINTER_FIELD)) {
      capnp::_::PointerReader::getStruct(&local_b8,(PointerReader *)&__range1,(word *)0x0);
      uVar1 = bounded<unsigned_short>((local_68->field_1).pointerIndex);
      capnp::_::StructReader::getPointerField(&local_88,&local_b8,(uint)uVar1);
      __range1 = (ArrayPtr<const_capnp::PipelineOp> *)local_88.segment;
      pointer.segment = (SegmentReader *)local_88.capTable;
      pointer.capTable = (CapTableReader *)local_88.pointer;
      pointer.pointer = (WirePointer *)CONCAT44(pointer.pointer._4_4_,local_88.nestingLimit);
    }
  }
  OVar2 = capnp::_::PointerReader::getCapability(&this->reader);
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<ClientHook> AnyPointer::Reader::getPipelinedCap(
    kj::ArrayPtr<const PipelineOp> ops) const {
  _::PointerReader pointer = reader;

  for (auto& op: ops) {
    switch (op.type) {
      case PipelineOp::Type::NOOP:
        break;

      case PipelineOp::Type::GET_POINTER_FIELD:
        pointer = pointer.getStruct(nullptr).getPointerField(bounded(op.pointerIndex) * POINTERS);
        break;
    }
  }

  return pointer.getCapability();
}